

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O1

Pass * wasm::createReorderGlobalsPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x38);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  pPVar1->_vptr_Pass = (_func_int **)&PTR__Pass_00d8aaa8;
  *(undefined1 *)&pPVar1[1]._vptr_Pass = 0;
  return pPVar1;
}

Assistant:

Pass* createReorderGlobalsPass() { return new ReorderGlobals(false); }